

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcmp.c
# Opt level: O0

int main(void)

{
  int iVar1;
  char local_19;
  char local_18 [7];
  char empty [1];
  char cmpabcd_ [6];
  char cmpabcde [6];
  
  stack0xffffffffffffffee = 0x64636261;
  local_18[0] = 'a';
  local_18[1] = 'b';
  local_18[2] = 'c';
  local_18[3] = 'd';
  local_18[4] = -4;
  local_18[5] = '\0';
  memset(&local_19,0,1);
  iVar1 = strcmp("abcde",local_18 + 6);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcmp.c, line %d - %s\n"
           ,0x21,"strcmp( abcde, cmpabcde ) == 0");
  }
  iVar1 = strcmp(&local_19,"abcde");
  if (-1 < iVar1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcmp.c, line %d - %s\n"
           ,0x24,"strcmp( empty, abcde ) < 0");
  }
  iVar1 = strcmp("abcde",&local_19);
  if (iVar1 < 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcmp.c, line %d - %s\n"
           ,0x25,"strcmp( abcde, empty ) > 0");
  }
  iVar1 = strcmp("abcde",local_18);
  if (-1 < iVar1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcmp.c, line %d - %s\n"
           ,0x26,"strcmp( abcde, cmpabcd_ ) < 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char cmpabcde[] = "abcde";
    char cmpabcd_[] = "abcd\xfc";
    char empty[] = "";
    TESTCASE( strcmp( abcde, cmpabcde ) == 0 );
    TESTCASE( strcmp( abcde, abcdx ) < 0 );
    TESTCASE( strcmp( abcdx, abcde ) > 0 );
    TESTCASE( strcmp( empty, abcde ) < 0 );
    TESTCASE( strcmp( abcde, empty ) > 0 );
    TESTCASE( strcmp( abcde, cmpabcd_ ) < 0 );
    return TEST_RESULTS;
}